

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFormFieldObjectHelper.cc
# Opt level: O0

void __thiscall
QPDFFormFieldObjectHelper::setRadioButtonValue
          (QPDFFormFieldObjectHelper *this,QPDFObjectHandle *name)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> key;
  bool bVar1;
  string *psVar2;
  bool local_532;
  bool local_45a;
  allocator<char> local_439;
  string local_438;
  QPDFObjectHandle local_418;
  allocator<char> local_401;
  string local_400;
  allocator<char> local_3d9;
  string local_3d8;
  byte local_3b1;
  string local_3b0;
  byte local_38c;
  byte local_38b;
  byte local_38a;
  allocator<char> local_389;
  string local_388 [32];
  QPDFObjectHandle local_368;
  byte local_354;
  byte local_353;
  byte local_352;
  allocator<char> local_351;
  string local_350 [32];
  QPDFObjectHandle local_330;
  allocator<char> local_319;
  string local_318;
  undefined1 local_2f8 [24];
  string local_2e0 [32];
  QPDFObjectHandle local_2c0;
  string *local_2b0;
  QPDFObjectHandle *grandkid;
  iterator __end3;
  iterator __begin3;
  string local_290 [32];
  QPDFObjectHandle local_270;
  Array local_260;
  Array *local_248;
  Array *__range3;
  QPDFObjectHandle annot;
  string local_228 [32];
  undefined1 local_208 [8];
  QPDFObjectHandle AP;
  QPDFObjectHandle *kid;
  iterator __end1;
  iterator __begin1;
  Array *__range1;
  allocator<char> local_1a9;
  string local_1a8;
  allocator<char> local_181;
  string local_180;
  undefined1 local_160 [24];
  string local_148 [32];
  QPDFObjectHandle kids;
  QPDFObjectHandle local_100;
  QPDFObjectHandle local_f0;
  undefined1 local_e0 [8];
  QPDFFormFieldObjectHelper ph;
  string local_a0 [32];
  QPDFObjectHandle local_80 [2];
  allocator<char> local_59;
  string local_58 [32];
  undefined1 local_38 [24];
  QPDFObjectHandle parent;
  QPDFObjectHandle *name_local;
  QPDFFormFieldObjectHelper *this_local;
  
  parent.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)name;
  QPDFObjectHelper::oh((QPDFObjectHelper *)local_38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_58,"/Parent",&local_59);
  QPDFObjectHandle::getKey((QPDFObjectHandle *)(local_38 + 0x10),(string *)local_38);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator(&local_59);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_38);
  ph.m.super___shared_ptr<QPDFFormFieldObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._6_1_ = 0;
  ph.m.super___shared_ptr<QPDFFormFieldObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._5_1_ = 0;
  ph.m.super___shared_ptr<QPDFFormFieldObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_1_ = 0;
  bVar1 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)(local_38 + 0x10));
  local_45a = false;
  if (bVar1) {
    std::allocator<char>::allocator();
    ph.m.super___shared_ptr<QPDFFormFieldObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._6_1_ = 1;
    std::__cxx11::string::string<std::allocator<char>>
              (local_a0,"/Parent",
               (allocator<char> *)
               ((long)&ph.m.
                       super___shared_ptr<QPDFFormFieldObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi + 7));
    ph.m.super___shared_ptr<QPDFFormFieldObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._5_1_ = 1;
    QPDFObjectHandle::getKey(local_80,(string *)(local_38 + 0x10));
    ph.m.super___shared_ptr<QPDFFormFieldObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._4_1_ = 1;
    local_45a = QPDFObjectHandle::isNull(local_80);
  }
  if ((ph.m.super___shared_ptr<QPDFFormFieldObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi._4_1_ & 1) != 0) {
    QPDFObjectHandle::~QPDFObjectHandle(local_80);
  }
  if ((ph.m.super___shared_ptr<QPDFFormFieldObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi._5_1_ & 1) != 0) {
    std::__cxx11::string::~string(local_a0);
  }
  if ((ph.m.super___shared_ptr<QPDFFormFieldObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi._6_1_ & 1) != 0) {
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&ph.m.
                       super___shared_ptr<QPDFFormFieldObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi + 7));
  }
  if (local_45a != false) {
    QPDFObjectHandle::QPDFObjectHandle(&local_f0,(QPDFObjectHandle *)(local_38 + 0x10));
    QPDFFormFieldObjectHelper((QPDFFormFieldObjectHelper *)local_e0,&local_f0);
    QPDFObjectHandle::~QPDFObjectHandle(&local_f0);
    kids.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi._4_1_ = isRadioButton((QPDFFormFieldObjectHelper *)local_e0);
    if (kids.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi._4_1_) {
      QTC::TC("qpdf","QPDFFormFieldObjectHelper set parent radio button",0);
      QPDFObjectHandle::QPDFObjectHandle(&local_100,name);
      setRadioButtonValue((QPDFFormFieldObjectHelper *)local_e0,&local_100);
      QPDFObjectHandle::~QPDFObjectHandle(&local_100);
    }
    kids.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi._5_3_ = 0;
    ~QPDFFormFieldObjectHelper((QPDFFormFieldObjectHelper *)local_e0);
    if (kids.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi._4_4_ != 0) goto LAB_001e10a3;
  }
  QPDFObjectHelper::oh((QPDFObjectHelper *)&stack0xfffffffffffffed8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_148,"/Kids",(allocator<char> *)(local_160 + 0x17));
  QPDFObjectHandle::getKey
            ((QPDFObjectHandle *)&stack0xfffffffffffffee8,(string *)&stack0xfffffffffffffed8);
  std::__cxx11::string::~string(local_148);
  std::allocator<char>::~allocator((allocator<char> *)(local_160 + 0x17));
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&stack0xfffffffffffffed8);
  bVar1 = isRadioButton(this);
  if (((bVar1) && (bVar1 = QPDFObjectHandle::isNull((QPDFObjectHandle *)(local_38 + 0x10)), bVar1))
     && (bVar1 = QPDFObjectHandle::isArray((QPDFObjectHandle *)&stack0xfffffffffffffee8), bVar1)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a8,"/V",&local_1a9);
    QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)&__range1,name);
    setFieldAttribute(this,&local_1a8,(QPDFObjectHandle *)&__range1);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&__range1);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::allocator<char>::~allocator(&local_1a9);
    QPDFObjectHandle::as_array((Array *)&__begin1,(QPDFObjectHandle *)&stack0xfffffffffffffee8,any);
    __end1 = ::qpdf::Array::begin((Array *)&__begin1);
    kid = (QPDFObjectHandle *)::qpdf::Array::end((Array *)&__begin1);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
                                       *)&kid), bVar1) {
      psVar2 = (string *)
               __gnu_cxx::
               __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
               ::operator*(&__end1);
      AP.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)psVar2;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_228,"/AP",
                 (allocator<char> *)
                 ((long)&annot.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi + 7));
      QPDFObjectHandle::getKey((QPDFObjectHandle *)local_208,psVar2);
      std::__cxx11::string::~string(local_228);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&annot.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi + 7));
      QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)&__range3);
      bVar1 = ::qpdf::BaseHandle::null((BaseHandle *)local_208);
      key = AP.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount;
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (local_290,"/Kids",(allocator<char> *)((long)&__begin3._M_current + 7));
        QPDFObjectHandle::getKey(&local_270,(string *)key._M_pi);
        QPDFObjectHandle::as_array(&local_260,&local_270,any);
        QPDFObjectHandle::~QPDFObjectHandle(&local_270);
        std::__cxx11::string::~string(local_290);
        std::allocator<char>::~allocator((allocator<char> *)((long)&__begin3._M_current + 7));
        local_248 = &local_260;
        __end3 = ::qpdf::Array::begin(local_248);
        grandkid = (QPDFObjectHandle *)::qpdf::Array::end(local_248);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end3,(__normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
                                           *)&grandkid), bVar1) {
          psVar2 = (string *)
                   __gnu_cxx::
                   __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
                   ::operator*(&__end3);
          local_2b0 = psVar2;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (local_2e0,"/AP",(allocator<char> *)(local_2f8 + 0x17));
          QPDFObjectHandle::getKey(&local_2c0,psVar2);
          QPDFObjectHandle::operator=((QPDFObjectHandle *)local_208,&local_2c0);
          QPDFObjectHandle::~QPDFObjectHandle(&local_2c0);
          std::__cxx11::string::~string(local_2e0);
          std::allocator<char>::~allocator((allocator<char> *)(local_2f8 + 0x17));
          bVar1 = ::qpdf::BaseHandle::null((BaseHandle *)local_208);
          if (!bVar1) {
            QTC::TC("qpdf","QPDFFormFieldObjectHelper radio button grandkid",0);
            QPDFObjectHandle::operator=((QPDFObjectHandle *)&__range3,(QPDFObjectHandle *)local_2b0)
            ;
            break;
          }
          __gnu_cxx::
          __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
          ::operator++(&__end3);
        }
        kids.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi._4_4_ = 4;
        ::qpdf::Array::~Array(&local_260);
      }
      else {
        QPDFObjectHandle::operator=
                  ((QPDFObjectHandle *)&__range3,
                   (QPDFObjectHandle *)
                   AP.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
      bVar1 = ::qpdf::BaseHandle::operator_cast_to_bool((BaseHandle *)&__range3);
      if (bVar1) {
        local_352 = 0;
        local_353 = 0;
        local_354 = 0;
        local_38a = 0;
        local_38b = 0;
        local_38c = 0;
        local_3b1 = 0;
        bVar1 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)local_208);
        local_532 = false;
        if (bVar1) {
          std::allocator<char>::allocator();
          local_352 = 1;
          std::__cxx11::string::string<std::allocator<char>>(local_350,"/N",&local_351);
          local_353 = 1;
          QPDFObjectHandle::getKey(&local_330,(string *)local_208);
          local_354 = 1;
          bVar1 = QPDFObjectHandle::isDictionary(&local_330);
          local_532 = false;
          if (bVar1) {
            std::allocator<char>::allocator();
            local_38a = 1;
            std::__cxx11::string::string<std::allocator<char>>(local_388,"/N",&local_389);
            local_38b = 1;
            QPDFObjectHandle::getKey(&local_368,(string *)local_208);
            local_38c = 1;
            QPDFObjectHandle::getName_abi_cxx11_(&local_3b0,name);
            local_3b1 = 1;
            local_532 = QPDFObjectHandle::hasKey(&local_368,&local_3b0);
          }
        }
        if ((local_3b1 & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_3b0);
        }
        if ((local_38c & 1) != 0) {
          QPDFObjectHandle::~QPDFObjectHandle(&local_368);
        }
        if ((local_38b & 1) != 0) {
          std::__cxx11::string::~string(local_388);
        }
        if ((local_38a & 1) != 0) {
          std::allocator<char>::~allocator(&local_389);
        }
        if ((local_354 & 1) != 0) {
          QPDFObjectHandle::~QPDFObjectHandle(&local_330);
        }
        if ((local_353 & 1) != 0) {
          std::__cxx11::string::~string(local_350);
        }
        if ((local_352 & 1) != 0) {
          std::allocator<char>::~allocator(&local_351);
        }
        if (local_532 == false) {
          QTC::TC("qpdf","QPDFFormFieldObjectHelper turn off radio button",0);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_400,"/AS",&local_401);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_438,"/Off",&local_439)
          ;
          QPDFObjectHandle::newName(&local_418,&local_438);
          QPDFObjectHandle::replaceKey((QPDFObjectHandle *)&__range3,&local_400,&local_418);
          QPDFObjectHandle::~QPDFObjectHandle(&local_418);
          std::__cxx11::string::~string((string *)&local_438);
          std::allocator<char>::~allocator(&local_439);
          std::__cxx11::string::~string((string *)&local_400);
          std::allocator<char>::~allocator(&local_401);
        }
        else {
          QTC::TC("qpdf","QPDFFormFieldObjectHelper turn on radio button",0);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_3d8,"/AS",&local_3d9);
          QPDFObjectHandle::replaceKey((QPDFObjectHandle *)&__range3,&local_3d8,name);
          std::__cxx11::string::~string((string *)&local_3d8);
          std::allocator<char>::~allocator(&local_3d9);
        }
        kids.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi._4_4_ = 0;
      }
      else {
        QTC::TC("qpdf","QPDFObjectHandle broken radio button",0);
        QPDFObjectHelper::oh((QPDFObjectHelper *)local_2f8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_318,"unable to set the value of this radio button",&local_319);
        QPDFObjectHandle::warnIfPossible((QPDFObjectHandle *)local_2f8,&local_318);
        std::__cxx11::string::~string((string *)&local_318);
        std::allocator<char>::~allocator(&local_319);
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_2f8);
        kids.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi._4_4_ = 3;
      }
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&__range3);
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_208);
      __gnu_cxx::
      __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
      ::operator++(&__end1);
    }
    kids.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi._4_4_ = 2;
    ::qpdf::Array::~Array((Array *)&__begin1);
    kids.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi._4_4_ = 0;
  }
  else {
    QPDFObjectHelper::oh((QPDFObjectHelper *)local_160);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_180,
               "don\'t know how to set the value of this field as a radio button",&local_181);
    QPDFObjectHandle::warnIfPossible((QPDFObjectHandle *)local_160,&local_180);
    std::__cxx11::string::~string((string *)&local_180);
    std::allocator<char>::~allocator(&local_181);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_160);
    kids.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi._4_4_ = 1;
  }
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&stack0xfffffffffffffee8);
LAB_001e10a3:
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)(local_38 + 0x10));
  return;
}

Assistant:

void
QPDFFormFieldObjectHelper::setRadioButtonValue(QPDFObjectHandle name)
{
    // Set the value of a radio button field. This has the following specific behavior:
    // * If this is a radio button field that has a parent that is also a radio button field and has
    //   no explicit /V, call itself on the parent
    // * If this is a radio button field with children, set /V to the given value. Then, for each
    //   child, if the child has the specified value as one of its keys in the /N subdictionary of
    //   its /AP (i.e. its normal appearance stream dictionary), set /AS to name; otherwise, if /Off
    //   is a member, set /AS to /Off.
    // Note that we never turn on /NeedAppearances when setting a radio button field.
    QPDFObjectHandle parent = oh().getKey("/Parent");
    if (parent.isDictionary() && parent.getKey("/Parent").isNull()) {
        QPDFFormFieldObjectHelper ph(parent);
        if (ph.isRadioButton()) {
            // This is most likely one of the individual buttons. Try calling on the parent.
            QTC::TC("qpdf", "QPDFFormFieldObjectHelper set parent radio button");
            ph.setRadioButtonValue(name);
            return;
        }
    }

    QPDFObjectHandle kids = oh().getKey("/Kids");
    if (!(isRadioButton() && parent.isNull() && kids.isArray())) {
        oh().warnIfPossible("don't know how to set the value of this field as a radio button");
        return;
    }
    setFieldAttribute("/V", name);
    for (auto const& kid: kids.as_array()) {
        QPDFObjectHandle AP = kid.getKey("/AP");
        QPDFObjectHandle annot;
        if (AP.null()) {
            // The widget may be below. If there is more than one, just find the first one.
            for (auto const& grandkid: kid.getKey("/Kids").as_array()) {
                AP = grandkid.getKey("/AP");
                if (!AP.null()) {
                    QTC::TC("qpdf", "QPDFFormFieldObjectHelper radio button grandkid");
                    annot = grandkid;
                    break;
                }
            }
        } else {
            annot = kid;
        }
        if (!annot) {
            QTC::TC("qpdf", "QPDFObjectHandle broken radio button");
            oh().warnIfPossible("unable to set the value of this radio button");
            continue;
        }
        if (AP.isDictionary() && AP.getKey("/N").isDictionary() &&
            AP.getKey("/N").hasKey(name.getName())) {
            QTC::TC("qpdf", "QPDFFormFieldObjectHelper turn on radio button");
            annot.replaceKey("/AS", name);
        } else {
            QTC::TC("qpdf", "QPDFFormFieldObjectHelper turn off radio button");
            annot.replaceKey("/AS", QPDFObjectHandle::newName("/Off"));
        }
    }
}